

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O2

void alloc_hist_array(void)

{
  int iVar1;
  message *__ptr;
  wchar_t wVar2;
  wchar_t wVar3;
  message *pmVar4;
  long lVar5;
  ulong uVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  bool bVar9;
  
  wVar8 = histpos;
  wVar2 = histsize;
  __ptr = msghistory;
  iVar1 = settings.msghistory;
  pmVar4 = (message *)calloc((long)settings.msghistory,0x10);
  histpos = L'\xffffffff';
  histsize = iVar1;
  lVar5 = 0;
  uVar6 = 0;
  if (0 < iVar1) {
    uVar6 = (ulong)(uint)iVar1;
  }
  msghistory = pmVar4;
  for (; uVar6 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
    *(undefined4 *)((long)&pmVar4->turn + lVar5) = 0;
    *(undefined8 *)((long)&pmVar4->msg + lVar5) = 0;
  }
  if (__ptr != (message *)0x0) {
    wVar8 = wVar8 + L'\x01';
    wVar7 = L'\0';
    if (L'\0' < wVar2) {
      wVar7 = wVar2;
    }
    while (bVar9 = wVar7 != L'\0', wVar7 = wVar7 + L'\xffffffff', bVar9) {
      wVar3 = wVar2;
      if (wVar8 < wVar2) {
        wVar3 = L'\0';
      }
      if (__ptr[wVar8 - wVar3].turn != L'\0') {
        store_message(__ptr[wVar8 - wVar3].turn,__ptr[wVar8 - wVar3].msg);
      }
      free(__ptr[wVar8 - wVar3].msg);
      wVar8 = wVar8 + L'\x01';
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void alloc_hist_array(void)
{
    struct message *oldhistory = msghistory;
    int i, oldsize = histsize, oldpos = histpos;
    
    msghistory = calloc(settings.msghistory, sizeof(struct message));
    histsize = settings.msghistory;
    histpos = -1; /* histpos is incremented before any message is stored */
    for (i = 0; i < histsize; i++) {
	msghistory[i].turn = 0;
	msghistory[i].msg = NULL;
    }

    if (!oldhistory)
	return;
    
    for (i = 0; i < oldsize; i++) {
	int pos = oldpos + i + 1;
	if (pos >= oldsize) /* wrap around eventually */
	    pos -= oldsize;
	
	if (oldhistory[pos].turn)
	    store_message(oldhistory[pos].turn, oldhistory[pos].msg);
	if (oldhistory[pos].msg)
	    free(oldhistory[pos].msg);
    }
    
    free(oldhistory);
}